

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::update_target_priority(raft_server *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  element_type *peVar4;
  timer_helper *in_RDI;
  int32 cur_priority;
  srv_config *s_conf;
  peer *peer_elem;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range1;
  int32 max_priority;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_ffffffffffffff68;
  pre_vote_status_t *in_stack_ffffffffffffff70;
  string *format;
  string local_68 [36];
  int32 local_44;
  srv_config *local_40;
  element_type *local_38;
  reference local_30;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_28;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_20;
  undefined1 *local_18;
  int local_c [3];
  
  local_c[0] = *(int *)((long)&(in_RDI->lock_).super___mutex_base._M_mutex + 0x24);
  local_18 = (undefined1 *)((long)&in_RDI[7].lock_.super___mutex_base._M_mutex + 8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  while (bVar1 = std::__detail::operator!=(&local_20,&local_28), bVar1) {
    local_30 = std::__detail::
               _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
               operator*((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                          *)0x2febf7);
    local_38 = std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(local_30->second).
                           super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
    local_40 = peer::get_config((peer *)0x2fec19);
    local_44 = srv_config::get_priority(local_40);
    piVar3 = std::max<int>(local_c,&local_44);
    local_c[0] = *piVar3;
    std::__detail::
    _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )in_stack_ffffffffffffff70);
  }
  if (local_c[0] < 1) {
    *(undefined4 *)&in_RDI[1].t_created_.__d.__r = 1;
  }
  else {
    *(int *)&in_RDI[1].t_created_.__d.__r = local_c[0];
  }
  timer_helper::reset(in_RDI);
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff70,
             SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2fecbd);
  srv_state::get_term((srv_state *)0x2fecc5);
  pre_vote_status_t::reset(in_stack_ffffffffffffff70,(ulong)in_stack_ffffffffffffff68);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[0xc].lock_);
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2fecfd);
    iVar2 = (*peVar4->_vptr_logger[7])();
    if (5 < iVar2) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2fed20);
      format = local_68;
      msg_if_given_abi_cxx11_
                ((char *)format,"(update) new target priority: %d",
                 (ulong)(uint)in_RDI[1].t_created_.__d.__r);
      (*peVar4->_vptr_logger[8])
                (peVar4,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                 ,"update_target_priority",0xef,format);
      std::__cxx11::string::~string(local_68);
    }
  }
  return;
}

Assistant:

void raft_server::update_target_priority() {
    // Get max priority among all peers, including myself.
    int32 max_priority = my_priority_;
    for (auto& entry: peers_) {
        peer* peer_elem = entry.second.get();
        const srv_config& s_conf = peer_elem->get_config();
        int32 cur_priority = s_conf.get_priority();
        max_priority = std::max(max_priority, cur_priority);
    }
    if (max_priority > 0) {
        target_priority_ = max_priority;
    } else {
        target_priority_ = srv_config::INIT_PRIORITY;
    }
    priority_change_timer_.reset();

    hb_alive_ = true;
    pre_vote_.reset(state_->get_term());
    p_tr("(update) new target priority: %d", target_priority_);
}